

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheYouhuaMain.cpp
# Opt level: O0

bool parsePara(int argc,char **argv)

{
  long in_RSI;
  
  trace_file_name = *(char **)(in_RSI + 8);
  loop = atoi(*(char **)(in_RSI + 0x10));
  mct_size = atoi(*(char **)(in_RSI + 0x18));
  return trace_file_name != (char *)0x0;
}

Assistant:

bool parsePara(int argc, char **argv) {
//    for (int i = 1; i < argc; i++) {
//        if (argv[i][0] == '-') {
//            switch (argv[i][1]) {
//                case 'v':
//                    verbose = true;
//                    break;
//                case 's':
//                    single_step = true;
//                    break;
//                default:
//                    return false;
//            }
//        } else {
    trace_file_name = argv[1];
    loop = atoi(argv[2]);
    mct_size = atoi(argv[3]);
//        }
//    }

    return trace_file_name != nullptr;
}